

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_identity_circular_check(lysc_ctx *ctx,lysc_ident *ident,lysc_ident **derived)

{
  long lVar1;
  ulong local_78;
  lysc_ident *local_68;
  lysc_ident *drv;
  ly_set recursion;
  uint64_t v;
  uint64_t u;
  LY_ERR ret;
  lysc_ident **derived_local;
  lysc_ident *ident_local;
  lysc_ctx *ctx_local;
  
  u._4_4_ = LY_SUCCESS;
  memset(&drv,0,0x10);
  if (derived == (lysc_ident **)0x0) {
    return LY_SUCCESS;
  }
  v = 0;
  while( true ) {
    if (derived == (lysc_ident **)0x0) {
      local_68 = (lysc_ident *)0x0;
    }
    else {
      local_68 = derived[-1];
    }
    if (local_68 <= v) break;
    if (ident == derived[v]) {
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Identity \"%s\" is indirectly derived from itself.",ident->name);
      u._4_4_ = LY_EVALID;
      goto LAB_0016244b;
    }
    u._4_4_ = ly_set_add((ly_set *)&drv,derived[v],'\0',(uint32_t *)0x0);
    if (u._4_4_ != LY_SUCCESS) goto LAB_0016244b;
    v = v + 1;
  }
  for (recursion.field_2.dnodes = (lyd_node **)0x0;
      recursion.field_2.dnodes < (lyd_node **)(ulong)drv._4_4_;
      recursion.field_2.dnodes = recursion.field_2.dnodes + 1) {
    lVar1 = *(long *)(recursion._0_8_ + (long)recursion.field_2.dnodes * 8);
    v = 0;
    while( true ) {
      if (*(long *)(lVar1 + 0x20) == 0) {
        local_78 = 0;
      }
      else {
        local_78 = *(ulong *)(*(long *)(lVar1 + 0x20) + -8);
      }
      if (local_78 <= v) break;
      if (ident == *(lysc_ident **)(*(long *)(lVar1 + 0x20) + v * 8)) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                "Identity \"%s\" is indirectly derived from itself.",ident->name);
        u._4_4_ = LY_EVALID;
        goto LAB_0016244b;
      }
      u._4_4_ = ly_set_add((ly_set *)&drv,*(void **)(*(long *)(lVar1 + 0x20) + v * 8),'\0',
                           (uint32_t *)0x0);
      if (u._4_4_ != LY_SUCCESS) goto LAB_0016244b;
      v = v + 1;
    }
  }
LAB_0016244b:
  ly_set_erase((ly_set *)&drv,(_func_void_void_ptr *)0x0);
  return u._4_4_;
}

Assistant:

static LY_ERR
lys_compile_identity_circular_check(struct lysc_ctx *ctx, struct lysc_ident *ident, struct lysc_ident **derived)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;
    struct ly_set recursion = {0};
    struct lysc_ident *drv;

    if (!derived) {
        return LY_SUCCESS;
    }

    for (u = 0; u < LY_ARRAY_COUNT(derived); ++u) {
        if (ident == derived[u]) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Identity \"%s\" is indirectly derived from itself.", ident->name);
            ret = LY_EVALID;
            goto cleanup;
        }
        ret = ly_set_add(&recursion, derived[u], 0, NULL);
        LY_CHECK_GOTO(ret, cleanup);
    }

    for (v = 0; v < recursion.count; ++v) {
        drv = recursion.objs[v];
        for (u = 0; u < LY_ARRAY_COUNT(drv->derived); ++u) {
            if (ident == drv->derived[u]) {
                LOGVAL(ctx->ctx, LYVE_REFERENCE,
                        "Identity \"%s\" is indirectly derived from itself.", ident->name);
                ret = LY_EVALID;
                goto cleanup;
            }
            ret = ly_set_add(&recursion, drv->derived[u], 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    ly_set_erase(&recursion, NULL);
    return ret;
}